

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

int src_process(SRC_STATE *state,SRC_DATA *data)

{
  int iVar1;
  SRC_ERROR local_24;
  int error;
  SRC_DATA *data_local;
  SRC_STATE *state_local;
  
  if (state == (SRC_STATE *)0x0) {
    state_local._4_4_ = SRC_ERR_BAD_STATE;
  }
  else if (state->mode == SRC_MODE_PROCESS) {
    if (data == (SRC_DATA *)0x0) {
      state_local._4_4_ = SRC_ERR_BAD_DATA;
    }
    else if (((data->data_in == (float *)0x0) && (0 < data->input_frames)) ||
            ((data->data_out == (float *)0x0 && (0 < data->output_frames)))) {
      state_local._4_4_ = SRC_ERR_BAD_DATA_PTR;
    }
    else {
      iVar1 = is_bad_src_ratio(data->src_ratio);
      if (iVar1 == 0) {
        if (data->input_frames < 0) {
          data->input_frames = 0;
        }
        if (data->output_frames < 0) {
          data->output_frames = 0;
        }
        if (data->data_in < data->data_out) {
          if (data->data_out < data->data_in + data->input_frames * (long)state->channels) {
            return 0x10;
          }
        }
        else if (data->data_in < data->data_out + data->output_frames * (long)state->channels) {
          return 0x10;
        }
        data->input_frames_used = 0;
        data->output_frames_gen = 0;
        if (state->last_ratio <= 0.00390625 && state->last_ratio != 0.00390625) {
          state->last_ratio = data->src_ratio;
        }
        if (1e-15 <= ABS(state->last_ratio - data->src_ratio)) {
          local_24 = (*state->vt->vari_process)(state,data);
        }
        else {
          local_24 = (*state->vt->const_process)(state,data);
        }
        state_local._4_4_ = local_24;
      }
      else {
        state_local._4_4_ = SRC_ERR_BAD_SRC_RATIO;
      }
    }
  }
  else {
    state_local._4_4_ = SRC_ERR_BAD_MODE;
  }
  return state_local._4_4_;
}

Assistant:

int
src_process (SRC_STATE *state, SRC_DATA *data)
{
	int error ;

	if (state == NULL)
		return SRC_ERR_BAD_STATE ;

	if (state->mode != SRC_MODE_PROCESS)
		return SRC_ERR_BAD_MODE ;

	/* Check for valid SRC_DATA first. */
	if (data == NULL)
		return SRC_ERR_BAD_DATA ;

	/* And that data_in and data_out are valid. */
	if ((data->data_in == NULL && data->input_frames > 0)
			|| (data->data_out == NULL && data->output_frames > 0))
		return SRC_ERR_BAD_DATA_PTR ;

	/* Check src_ratio is in range. */
	if (is_bad_src_ratio (data->src_ratio))
		return SRC_ERR_BAD_SRC_RATIO ;

	if (data->input_frames < 0)
		data->input_frames = 0 ;
	if (data->output_frames < 0)
		data->output_frames = 0 ;

	if (data->data_in < data->data_out)
	{	if (data->data_in + data->input_frames * state->channels > data->data_out)
		{	/*-printf ("\n\ndata_in: %p    data_out: %p\n",
				(void*) (data->data_in + data->input_frames * psrc->channels), (void*) data->data_out) ;-*/
			return SRC_ERR_DATA_OVERLAP ;
			} ;
		}
	else if (data->data_out + data->output_frames * state->channels > data->data_in)
	{	/*-printf ("\n\ndata_in : %p   ouput frames: %ld    data_out: %p\n", (void*) data->data_in, data->output_frames, (void*) data->data_out) ;

		printf ("data_out: %p (%p)    data_in: %p\n", (void*) data->data_out,
			(void*) (data->data_out + data->input_frames * psrc->channels), (void*) data->data_in) ;-*/
		return SRC_ERR_DATA_OVERLAP ;
		} ;

	/* Set the input and output counts to zero. */
	data->input_frames_used = 0 ;
	data->output_frames_gen = 0 ;

	/* Special case for when last_ratio has not been set. */
	if (state->last_ratio < (1.0 / SRC_MAX_RATIO))
		state->last_ratio = data->src_ratio ;

	/* Now process. */
	if (fabs (state->last_ratio - data->src_ratio) < 1e-15)
		error = state->vt->const_process (state, data) ;
	else
		error = state->vt->vari_process (state, data) ;

	return error ;
}